

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

bool __thiscall
testing::internal::
CartesianProductGenerator<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::Equals
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this,
          ParamIteratorInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
          *other)

{
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_false> _Var1;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>_>
  _Var2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this_00;
  GTestLog local_1c;
  
  iVar5 = (*(this->
            super_ParamIteratorInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
            )._vptr_ParamIteratorInterface[2])();
  iVar6 = (*other->_vptr_ParamIteratorInterface[2])(other);
  bVar3 = IsTrue(CONCAT44(extraout_var,iVar5) == CONCAT44(extraout_var_00,iVar6));
  if (!bVar3) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x36f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition BaseGenerator() == other.BaseGenerator() failed. ",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The program attempted to compare iterators ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"from different generators.",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    GTestLog::~GTestLog(&local_1c);
  }
  this_00 = CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>::IteratorImpl<testing::internal::IndexSequence<0ul,1ul>>const,testing::internal::ParamIteratorInterface<std::tuple<unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>>const>
                      (other);
  bVar3 = AtEnd(this);
  if ((bVar3) && (bVar3 = AtEnd(this_00), bVar3)) {
    return true;
  }
  _Var1._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_char>,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
       .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_char>,_false>._M_head_impl.
       impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_char>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
       .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_false>.
       _M_head_impl;
  if ((_Var1._M_head_impl !=
       ((ParamIteratorInterface<unsigned_char> *)
       (this_00->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_char>,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
       .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_char>,_false>._M_head_impl.
       impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_char>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_char>_>_>
       .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_char>_*,_false>).
       _M_head_impl) &&
     (iVar5 = (*(_Var1._M_head_impl)->_vptr_ParamIteratorInterface[6])(), (char)iVar5 == '\0')) {
    return false;
  }
  _Var2._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_*,_false>
  ._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_char>,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
       .
       super__Head_base<1UL,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>_>
       ._M_t;
  if ((_Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_*,_false>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_*,_false>
        ._M_head_impl ==
      (_Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_*,_false>
       )*(_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>_>
          *)&(this_00->current_).
             super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_char>,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
             .
             super__Tuple_impl<1UL,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
             .
             super__Head_base<1UL,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>,_false>
             ._M_head_impl.impl_._M_t.
             super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>_>
     ) {
    uVar4 = 1;
  }
  else {
    uVar4 = (**(code **)(*(long *)_Var2._M_t.
                                  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>_>
                                  .
                                  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_*,_false>
                                  ._M_head_impl + 0x30))();
  }
  return (bool)uVar4;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }